

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_decimal.cpp
# Opt level: O3

bool __thiscall
icu_63::numparse::impl::DecimalMatcher::validateGroup
          (DecimalMatcher *this,int32_t sepType,int32_t count,bool isPrimary)

{
  short sVar1;
  bool bVar2;
  
  if (this->requireGroupingMatch == true) {
    if (sepType == 1) {
      if (isPrimary) {
        sVar1 = this->grouping1;
      }
      else {
        sVar1 = this->grouping2;
      }
      return sVar1 == count;
    }
    bVar2 = true;
    if ((sepType == 0) && (!isPrimary)) {
      return count <= this->grouping2 && count != 0;
    }
  }
  else {
    bVar2 = count != 1 || sepType != 1;
  }
  return bVar2;
}

Assistant:

bool DecimalMatcher::validateGroup(int32_t sepType, int32_t count, bool isPrimary) const {
    if (requireGroupingMatch) {
        if (sepType == -1) {
            // No such group (prevGroup before first shift).
            return true;
        } else if (sepType == 0) {
            // First group.
            if (isPrimary) {
                // No grouping separators is OK.
                return true;
            } else {
                return count != 0 && count <= grouping2;
            }
        } else if (sepType == 1) {
            // Middle group.
            if (isPrimary) {
                return count == grouping1;
            } else {
                return count == grouping2;
            }
        } else {
            U_ASSERT(sepType == 2);
            // After the decimal separator.
            return true;
        }
    } else {
        if (sepType == 1) {
            // #11230: don't accept middle groups with only 1 digit.
            return count != 1;
        } else {
            return true;
        }
    }
}